

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

void __thiscall
opengv::absolute_pose::modules::Epnp::relative_error
          (Epnp *this,double *rot_err,double *transl_err,double (*Rtrue) [3],double *ttrue,
          double (*Rest) [3],double *test)

{
  double *pdVar1;
  double *in_RDX;
  double *in_RSI;
  double *in_R8;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double *in_stack_00000008;
  double rot_err2;
  double rot_err1;
  double qest [4];
  double qtrue [4];
  double *in_stack_ffffffffffffff70;
  double (*in_stack_ffffffffffffff78) [3];
  Epnp *in_stack_ffffffffffffff80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  
  mat_to_quat(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  mat_to_quat(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_58 - local_78;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_58 - local_78;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (local_50 - local_70) * (local_50 - local_70);
  auVar4 = vfmadd213sd_fma(auVar20,auVar4,auVar32);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_48 - local_68;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_48 - local_68;
  auVar4 = vfmadd213sd_fma(auVar33,auVar5,auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_40 - local_60;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_40 - local_60;
  auVar4 = vfmadd213sd_fma(auVar6,auVar21,auVar4);
  sqrt(auVar4._0_8_);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_58;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_58;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_50 * local_50;
  auVar4 = vfmadd213sd_fma(auVar22,auVar7,auVar34);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_48;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_48;
  auVar4 = vfmadd213sd_fma(auVar35,auVar8,auVar4);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_40;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_40;
  auVar4 = vfmadd213sd_fma(auVar9,auVar23,auVar4);
  sqrt(auVar4._0_8_);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_58 + local_78;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_58 + local_78;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = (local_50 + local_70) * (local_50 + local_70);
  auVar4 = vfmadd213sd_fma(auVar24,auVar10,auVar36);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_48 + local_68;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_48 + local_68;
  auVar4 = vfmadd213sd_fma(auVar37,auVar11,auVar4);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_40 + local_60;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_40 + local_60;
  auVar4 = vfmadd213sd_fma(auVar12,auVar25,auVar4);
  sqrt(auVar4._0_8_);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_58;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_58;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_50 * local_50;
  auVar4 = vfmadd213sd_fma(auVar26,auVar13,auVar38);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_48;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_48;
  auVar4 = vfmadd213sd_fma(auVar39,auVar14,auVar4);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_40;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_40;
  auVar4 = vfmadd213sd_fma(auVar15,auVar27,auVar4);
  sqrt(auVar4._0_8_);
  pdVar1 = std::min<double>((double *)&stack0xffffffffffffff80,(double *)&stack0xffffffffffffff78);
  *in_RSI = *pdVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *in_R8 - *in_stack_00000008;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (in_R8[1] - in_stack_00000008[1]) * (in_R8[1] - in_stack_00000008[1]);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *in_R8 - *in_stack_00000008;
  auVar4 = vfmadd213sd_fma(auVar40,auVar16,auVar28);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = in_R8[2] - in_stack_00000008[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = in_R8[2] - in_stack_00000008[2];
  auVar4 = vfmadd213sd_fma(auVar17,auVar29,auVar4);
  dVar2 = sqrt(auVar4._0_8_);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *in_R8;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *in_R8;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = in_R8[1] * in_R8[1];
  auVar4 = vfmadd213sd_fma(auVar41,auVar18,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = in_R8[2];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = in_R8[2];
  auVar4 = vfmadd213sd_fma(auVar19,auVar31,auVar4);
  dVar3 = sqrt(auVar4._0_8_);
  *in_RDX = dVar2 / dVar3;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::relative_error(
    double & rot_err,
    double & transl_err,
    const double Rtrue[3][3],
    const double ttrue[3],
    const double Rest[3][3],
    const double test[3])
{
  double qtrue[4], qest[4];

  mat_to_quat(Rtrue, qtrue);
  mat_to_quat(Rest, qest);

  double rot_err1 = sqrt((qtrue[0] - qest[0]) * (qtrue[0] - qest[0]) +
                         (qtrue[1] - qest[1]) * (qtrue[1] - qest[1]) +
                         (qtrue[2] - qest[2]) * (qtrue[2] - qest[2]) +
                         (qtrue[3] - qest[3]) * (qtrue[3] - qest[3])) /
                    sqrt(qtrue[0] * qtrue[0] +
                         qtrue[1] * qtrue[1] +
                         qtrue[2] * qtrue[2] +
                         qtrue[3] * qtrue[3]);

  double rot_err2 = sqrt((qtrue[0] + qest[0]) * (qtrue[0] + qest[0]) +
                         (qtrue[1] + qest[1]) * (qtrue[1] + qest[1]) +
                         (qtrue[2] + qest[2]) * (qtrue[2] + qest[2]) +
                         (qtrue[3] + qest[3]) * (qtrue[3] + qest[3]) ) /
                    sqrt(qtrue[0] * qtrue[0] +
                         qtrue[1] * qtrue[1] +
                         qtrue[2] * qtrue[2] +
                         qtrue[3] * qtrue[3]);

  rot_err = min(rot_err1,rot_err2);

  transl_err = sqrt((ttrue[0] - test[0]) * (ttrue[0] - test[0]) +
                    (ttrue[1] - test[1]) * (ttrue[1] - test[1]) +
                    (ttrue[2] - test[2]) * (ttrue[2] - test[2])) /
               sqrt(ttrue[0] * ttrue[0] +
                    ttrue[1] * ttrue[1] +
                    ttrue[2] * ttrue[2]);
}